

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SubExtensionCase::iterate(SubExtensionCase *this)

{
  bool bVar1;
  TestLog *pTVar2;
  MessageBuilder *pMVar3;
  ContextInfo *this_00;
  char *name;
  MessageBuilder local_4a0;
  MessageBuilder local_320;
  MessageBuilder local_190;
  SubExtensionCase *local_10;
  SubExtensionCase *this_local;
  
  local_10 = this;
  pTVar2 = tcu::TestContext::getLog
                     ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar3 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [27])"Verifying that extension \"");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&this->m_extension);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [16])"\" is supported.");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  this_00 = gles31::Context::getContextInfo
                      ((this->super_ExtensionPackTestCase).super_TestCase.m_context);
  name = (char *)std::__cxx11::string::c_str();
  bVar1 = glu::ContextInfo::isExtensionSupported(this_00,name);
  if (bVar1) {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_320,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<(&local_320,(char (*) [24])"Extension is supported.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_320);
    tcu::TestContext::setTestResult
              ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    pTVar2 = tcu::TestContext::getLog
                       ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.
                        super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_4a0,pTVar2,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_4a0,(char (*) [35])"Error, extension is not supported.");
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_4a0);
    tcu::TestContext::setTestResult
              ((this->super_ExtensionPackTestCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Required extension not supported");
  }
  return STOP;
}

Assistant:

SubExtensionCase::IterateResult SubExtensionCase::iterate (void)
{
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying that extension \"" << m_extension << "\" is supported."
		<< tcu::TestLog::EndMessage;

	if (m_context.getContextInfo().isExtensionSupported(m_extension.c_str()))
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Extension is supported."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Error, extension is not supported."
			<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Required extension not supported");
	}

	return STOP;
}